

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.hpp
# Opt level: O0

ShaderCodeBufferDesc * __thiscall
Diligent::SPIRVShaderResources::GetUniformBufferDesc(SPIRVShaderResources *this,Uint32 Index)

{
  bool bVar1;
  Uint32 UVar2;
  Char *pCVar3;
  pointer pvVar4;
  char (*in_R8) [19];
  undefined1 local_70 [8];
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  Uint32 Index_local;
  SPIRVShaderResources *this_local;
  
  msg.field_2._12_4_ = Index;
  UVar2 = GetNumUBs(this);
  if (Index < UVar2) {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_UBReflectionBuffer);
    if (bVar1) {
      pvVar4 = std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::get
                         (&this->m_UBReflectionBuffer);
      this_local = (SPIRVShaderResources *)((long)pvVar4 + (ulong)(uint)msg.field_2._12_4_ * 0x10);
    }
    else {
      FormatString<char[128]>
                ((string *)local_70,
                 (char (*) [128])
                 "Uniform buffer reflection information is not loaded. Please set the LoadConstantBufferReflection flag when creating the shader."
                );
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"GetUniformBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/SPIRVShaderResources.hpp"
                 ,0xd3);
      std::__cxx11::string::~string((string *)local_70);
      this_local = (SPIRVShaderResources *)0x0;
    }
  }
  else {
    FormatString<char[23],unsigned_int,char[19]>
              ((string *)local_40,(Diligent *)"Uniform buffer index (",
               (char (*) [23])((long)&msg.field_2 + 0xc),(uint *)") is out of range.",in_R8);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"GetUniformBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/SPIRVShaderResources.hpp"
               ,0xcd);
    std::__cxx11::string::~string((string *)local_40);
    this_local = (SPIRVShaderResources *)0x0;
  }
  return (ShaderCodeBufferDesc *)this_local;
}

Assistant:

const ShaderCodeBufferDesc* GetUniformBufferDesc(Uint32 Index) const
    {
        if (Index >= GetNumUBs())
        {
            UNEXPECTED("Uniform buffer index (", Index, ") is out of range.");
            return nullptr;
        }

        if (!m_UBReflectionBuffer)
        {
            UNEXPECTED("Uniform buffer reflection information is not loaded. Please set the LoadConstantBufferReflection flag when creating the shader.");
            return nullptr;
        }

        return reinterpret_cast<const ShaderCodeBufferDesc*>(m_UBReflectionBuffer.get()) + Index;
    }